

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_write.cpp
# Opt level: O2

void readvector(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *c,string *filename)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  string str;
  string stra;
  string local_298 [32];
  string local_278;
  string local_258;
  ifstream b;
  
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  stra._M_dataplus._M_p = (pointer)&stra.field_2;
  stra._M_string_length = 0;
  stra.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&b);
  std::ifstream::open((string *)&b,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"\nfailure to read file");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&b,(string *)&str);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    lVar5 = std::__cxx11::string::find((char *)&str,0x10a064);
    if (lVar5 != -1) {
      std::__cxx11::string::find((char *)&str,0x10a064);
      std::__cxx11::string::substr((ulong)local_298,(ulong)&str);
      std::__cxx11::string::operator=((string *)&str,local_298);
      std::__cxx11::string::~string(local_298);
    }
    for (uVar7 = 0; uVar7 < str._M_string_length; uVar7 = uVar7 + 1) {
      pcVar6 = (char *)std::__cxx11::string::at((ulong)&str);
      if (*pcVar6 == ' ') {
        std::__cxx11::string::substr((ulong)local_298,(ulong)&str);
        std::__cxx11::string::operator=((string *)&stra,local_298);
        std::__cxx11::string::~string(local_298);
        std::__cxx11::string::string((string *)&local_258,(string *)&stra);
        bVar2 = check_string(&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        if (bVar2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(c,&stra);
        }
      }
    }
    std::__cxx11::string::substr((ulong)local_298,(ulong)&str);
    std::__cxx11::string::operator=((string *)&stra,local_298);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::string((string *)&local_278,(string *)&stra);
    bVar2 = check_string(&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(c,&stra);
    }
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&b);
  std::__cxx11::string::~string((string *)&stra);
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

void readvector(vector<string>& c,string filename)
{
	string str,stra;
	int ignore=0;
	int begin = 0;
	int l=0;
	int i = 0;
	int j = 0;
	ifstream b;
	b.open(filename);
	if (!b.is_open()) { cout << "\nfailure to read file" << endl; }
	while (getline(b, str))
	{
			if (str.find("//") != string::npos)
			{
				str = str.substr(0, str.find("//"));
			}
			for (i = 0; i < str.length(); i++)
			{
				l++;
				if (str.at(i) == ' ')
				{
					stra = str.substr(begin, l - 1);
					if (check_string( stra)) {
						c.push_back(stra);
						begin = i + 1;
						l = 0;
					}
					
				}
			}
			stra = str.substr(begin);
			if (check_string(stra))
			{
				c.push_back(stra);
			}
			l = 0;
			begin = 0;


	}
	b.close();

	return;
}